

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O3

int do_iaf_psc(int argc,char **argv)

{
  _Bool _Var1;
  int iVar2;
  img *__ptr;
  code *pcVar3;
  char *p_path;
  char **argv_1;
  char **argv_00;
  int argc_1;
  int iVar4;
  char *__format;
  char *pcVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  igsc_device_handle handle;
  char *local_50;
  undefined8 local_48;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (argc < 1) {
    iVar4 = -1;
    if (quiet == 0) {
      do_iaf_psc_cold_7();
    }
  }
  else {
    pcVar5 = *argv;
    iVar4 = argc + -1;
    argv_00 = argv + 1;
    _Var1 = arg_is_token(pcVar5,"update");
    if (_Var1) {
      if (iVar4 == 0) {
        iVar4 = -1;
        if (quiet == 0) {
          do_iaf_psc_cold_6();
        }
      }
      else {
        pcVar6 = (char *)0x0;
        p_path = (char *)0x0;
        do {
          pcVar5 = *argv_00;
          _Var1 = arg_is_quiet(pcVar5);
          if (_Var1) {
            quiet = 1;
          }
          else {
            _Var1 = arg_is_device(pcVar5);
            if (_Var1) {
              if (iVar4 == 1) {
                iVar4 = -1;
                if (quiet == 0) {
                  do_iaf_psc_cold_2();
                }
                goto LAB_00107113;
              }
              pcVar6 = argv_00[1];
            }
            else {
              _Var1 = arg_is_image(pcVar5);
              if (!_Var1) goto LAB_00106f92;
              if (iVar4 == 1) {
                iVar4 = -1;
                if (quiet == 0) {
                  do_iaf_psc_cold_1();
                }
                goto LAB_00107113;
              }
              p_path = argv_00[1];
            }
            iVar4 = iVar4 + -1;
            argv_00 = argv_00 + 1;
          }
          argv_00 = argv_00 + 1;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
        if (p_path == (char *)0x0) {
          iVar4 = -1;
          if (quiet == 0) {
            do_iaf_psc_cold_5();
          }
        }
        else {
          local_50 = (char *)0x0;
          local_48 = 0;
          if ((pcVar6 == (char *)0x0) &&
             (iVar4 = get_first_device(&local_50), pcVar6 = local_50,
             local_50 == (char *)0x0 || iVar4 != 0)) {
            iVar4 = 1;
            if (quiet == 0) {
              do_iaf_psc_cold_4();
            }
          }
          else {
            pcVar5 = local_50;
            __ptr = image_read_from_file(p_path);
            if (__ptr == (img *)0x0) {
              iVar2 = 1;
              iVar4 = 1;
              if (quiet == 0) {
                __format = "Error: Failed to read :%s\n";
LAB_001070a5:
                fprintf(_stderr,__format,p_path);
                iVar4 = iVar2;
              }
            }
            else {
              iVar2 = igsc_device_init_by_device(&local_48,pcVar6);
              if (iVar2 == 0) {
                pcVar3 = progress_percentage_func;
                if ((quiet & 1) != 0) {
                  pcVar3 = (code *)0x0;
                }
                iVar2 = igsc_iaf_psc_update(&local_48,__ptr + 1,__ptr->size,pcVar3,0);
                if (quiet == 0) {
                  putchar(10);
                }
                iVar4 = 0;
                if ((iVar2 != 0) && (iVar4 = iVar2, quiet == 0)) {
                  do_iaf_psc_cold_3();
                  iVar4 = local_3c;
                }
              }
              else {
                iVar4 = iVar2;
                if ((quiet & 1) == 0) {
                  __format = "Error: Cannot initialize device: %s\n";
                  p_path = pcVar6;
                  goto LAB_001070a5;
                }
              }
            }
            igsc_device_close(&local_48);
            free(__ptr);
            free(pcVar5);
          }
        }
      }
    }
    else {
      _Var1 = arg_is_token(pcVar5,"version");
      if (_Var1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          iVar4 = do_no_special_args_func(iVar4,argv_00,iaf_psc_version);
          return iVar4;
        }
        goto LAB_0010714c;
      }
LAB_00106f92:
      iVar4 = -1;
      if (quiet == 0) {
        fprintf(_stderr,"Error: Wrong argument %s\n",pcVar5);
      }
    }
  }
LAB_00107113:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar4;
  }
LAB_0010714c:
  __stack_chk_fail();
}

Assistant:

static int do_iaf_psc(int argc, char *argv[])
{
    const char *sub_command = NULL;

    if (argc <= 0)
    {
        fwupd_error("Missing arguments\n");
        return ERROR_BAD_ARGUMENT;
    }

    sub_command = argv[0];

    arg_next(&argc, &argv);

    if (arg_is_token(sub_command, "update"))
    {
        return do_iaf_psc_update(argc, argv);
    }

    if (arg_is_token(sub_command, "version"))
    {
        return do_iaf_psc_version(argc, argv);
    }

    fwupd_error("Wrong argument %s\n", sub_command);
    return ERROR_BAD_ARGUMENT;
}